

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O1

void MPIX_step_send(comm_pkg *comm,void *send_data,int tag,MPI_Comm mpi_comm,MPI_Datatype mpi_type,
                   MPI_Request *send_requests,char **send_buffer_ptr)

{
  MPI_Datatype poVar1;
  char *pcVar2;
  int iVar3;
  comm_data *pcVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int type_size;
  int size;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  comm_pkg *local_58;
  void *local_50;
  MPI_Datatype local_48;
  MPI_Request *local_40;
  long local_38;
  
  local_6c = tag;
  local_50 = send_data;
  local_40 = send_requests;
  MPI_Type_size(mpi_type);
  iVar3 = comm->send_data->size_msgs;
  local_48 = mpi_type;
  if (iVar3 == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    MPI_Pack_size(iVar3,mpi_type,mpi_comm,&local_5c);
    iVar3 = -1;
    if (-1 < local_5c) {
      iVar3 = local_5c;
    }
    pcVar2 = (char *)operator_new__((long)iVar3);
  }
  poVar1 = local_48;
  local_70 = 0;
  pcVar4 = comm->send_data;
  if (0 < pcVar4->num_msgs) {
    lVar7 = 0;
    local_58 = comm;
    do {
      local_68 = pcVar4->procs[lVar7];
      iVar3 = pcVar4->indptr[lVar7];
      lVar5 = (long)iVar3;
      iVar6 = pcVar4->indptr[lVar7 + 1];
      local_64 = local_70;
      local_38 = lVar7;
      if (iVar3 < iVar6) {
        iVar6 = iVar6 - iVar3;
        do {
          MPI_Pack((void *)((long)local_60 * (long)local_58->send_data->indices[lVar5] +
                           (long)local_50),1,poVar1,pcVar2,local_5c,&local_70,mpi_comm);
          lVar5 = lVar5 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      lVar7 = local_38 + 1;
      MPI_Isend(pcVar2 + local_64,local_70 - local_64,&ompi_mpi_packed,local_68,local_6c,mpi_comm,
                local_40 + local_38);
      pcVar4 = local_58->send_data;
    } while (lVar7 < pcVar4->num_msgs);
  }
  if (pcVar2 != (char *)0x0) {
    *send_buffer_ptr = pcVar2;
  }
  return;
}

Assistant:

static void MPIX_step_send(comm_pkg* comm, void* send_data,
        int tag, MPI_Comm mpi_comm, MPI_Datatype mpi_type,
        MPI_Request* send_requests, char** send_buffer_ptr)
{
    int idx, proc, start, end;
    int size, type_size, addr;
    char* send_buffer = NULL;
    char* data = reinterpret_cast<char*>(send_data);
    MPI_Type_size(mpi_type, &type_size);
    if (comm->send_data->size_msgs)
    {
        MPI_Pack_size(comm->send_data->size_msgs, mpi_type, mpi_comm, &size);
        send_buffer = new char[size];
    }

    int ctr = 0;
    int prev_ctr = 0;
    for (int i = 0; i < comm->send_data->num_msgs; i++)
    {
        proc = comm->send_data->procs[i];
        start = comm->send_data->indptr[i];
        end = comm->send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = comm->send_data->indices[j];
            MPI_Pack(&(data[idx*type_size]), 1, mpi_type, 
                    send_buffer, size, &ctr, mpi_comm);
        }
        MPI_Isend(&send_buffer[prev_ctr], ctr - prev_ctr, MPI_PACKED, proc, tag,
                mpi_comm, &send_requests[i]);
        prev_ctr = ctr;
    }

    if (send_buffer) *send_buffer_ptr = send_buffer;
}